

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult * __thiscall
testing::AssertionResult::operator<<
          (AssertionResult *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  char cVar1;
  long *local_20;
  
  testing::Message::Message((Message *)&local_20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_20 + 2),(value->_M_dataplus)._M_p,value->_M_string_length);
  AppendMessage(this,(Message *)&local_20);
  if (((local_20 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
     (local_20 != (long *)0x0)) {
    (**(code **)(*local_20 + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }